

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs_tests.cpp
# Opt level: O2

void __thiscall fs_tests::create_directories::test_method(create_directories *this)

{
  long lVar1;
  readonly_property<bool> rVar2;
  bool bVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  check_type cVar6;
  char *local_298;
  char *local_290;
  undefined1 *local_288;
  undefined1 *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  undefined1 *local_228;
  undefined1 *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  assertion_result local_1e8;
  char **local_1d0;
  assertion_result local_1c8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  path local_100;
  path symlink;
  path local_b0;
  path dir;
  path tmpfolder;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase
            ((path *)&tmpfolder.super_path,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  std::filesystem::__cxx11::path::path(&local_b0,&tmpfolder.super_path);
  fs::operator/(&dir,(path *)&local_b0,"a");
  std::filesystem::__cxx11::path::~path(&local_b0);
  std::filesystem::create_directory((path *)&dir);
  local_110 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  file.m_end = (iterator)0x96;
  file.m_begin = (iterator)&local_110;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)std::filesystem::exists(&dir.super_path);
  local_1e8.m_message.px = (element_type *)0x0;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "fs::exists(dir)";
  local_1c8.m_message.px = (element_type *)0xb924c8;
  symlink.super_path._M_pathname._M_string_length._0_1_ = 0;
  symlink.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  symlink.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_130 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_128 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  symlink.super_path._M_pathname.field_2._8_8_ = &local_1c8;
  local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e8,(lazy_ostream *)&symlink,1,0,WARN,_cVar6,(size_t)&local_130,0x96);
  boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
  local_140 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  file_00.m_end = (iterator)0x97;
  file_00.m_begin = (iterator)&local_140;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_150,
             msg_00);
  local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::filesystem::is_directory(&dir.super_path);
  local_1e8.m_message.px = (element_type *)0x0;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "fs::is_directory(dir)";
  local_1c8.m_message.px = (element_type *)0xb924de;
  symlink.super_path._M_pathname._M_string_length._0_1_ = 0;
  symlink.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  symlink.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_160 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_158 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  symlink.super_path._M_pathname.field_2._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e8,(lazy_ostream *)&symlink,1,0,WARN,_cVar6,(size_t)&local_160,0x97);
  boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
  local_170 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  file_01.m_end = (iterator)0x98;
  file_01.m_begin = (iterator)&local_170;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_180,
             msg_01);
  bVar3 = fs::create_directories(&dir.super_path);
  local_1e8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_1e8.m_message.px = (element_type *)0x0;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1c8._0_8_ = "!fs::create_directories(dir)";
  local_1c8.m_message.px = (element_type *)0xb924fb;
  symlink.super_path._M_pathname._M_string_length._0_1_ = 0;
  symlink.super_path._M_pathname._M_dataplus._M_p = "<W\x1b";
  symlink.super_path._M_pathname.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  local_190 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_188 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  symlink.super_path._M_pathname.field_2._8_8_ = &local_1c8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1e8,(lazy_ostream *)&symlink,1,0,WARN,_cVar6,(size_t)&local_190,0x98);
  boost::detail::shared_count::~shared_count(&local_1e8.m_message.pn);
  std::filesystem::__cxx11::path::path(&local_100,&tmpfolder.super_path);
  fs::operator/(&symlink,(path *)&local_100,"b");
  std::filesystem::__cxx11::path::~path(&local_100);
  std::filesystem::create_directory_symlink((path *)&dir,(path *)&symlink);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  file_02.m_end = (iterator)0x9c;
  file_02.m_begin = (iterator)&local_1a0;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
             msg_02);
  rVar2.super_class_property<bool>.value =
       (class_property<bool>)std::filesystem::exists(&symlink.super_path);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8 = "fs::exists(symlink)";
  local_1f0 = "";
  local_1e8.m_message.px = (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
  local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_208 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_200 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_1d0 = &local_1f8;
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar2.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)&local_1e8,1,0,WARN,_cVar6,(size_t)&local_208,0x9c);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_218 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_210 = "";
  local_228 = &boost::unit_test::basic_cstring<char_const>::null;
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  file_03.m_end = (iterator)0x9d;
  file_03.m_begin = (iterator)&local_218;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_228,
             msg_03);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::filesystem::is_symlink(&symlink.super_path);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8 = "fs::is_symlink(symlink)";
  local_1f0 = "";
  local_1e8.m_message.px = (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
  local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_238 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_230 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_1d0 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)&local_1e8,1,0,WARN,_cVar6,(size_t)&local_238,0x9d);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_04.m_end = pvVar5;
  msg_04.m_begin = pvVar4;
  file_04.m_end = (iterator)0x9e;
  file_04.m_begin = (iterator)&local_248;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_258,
             msg_04);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)std::filesystem::is_directory(&symlink.super_path);
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8 = "fs::is_directory(symlink)";
  local_1f0 = "";
  local_1e8.m_message.px = (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
  local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_260 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  local_1d0 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)&local_1e8,1,0,WARN,_cVar6,(size_t)&local_268,0x9e);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  local_278 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_270 = "";
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  msg_05.m_end = pvVar5;
  msg_05.m_begin = pvVar4;
  file_05.m_end = (iterator)0x9f;
  file_05.m_begin = (iterator)&local_278;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_288,
             msg_05);
  bVar3 = fs::create_directories(&symlink.super_path);
  local_1c8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar3;
  local_1c8.m_message.px = (element_type *)0x0;
  local_1c8.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1f8 = "!fs::create_directories(symlink)";
  local_1f0 = "";
  local_1e8.m_message.px = (element_type *)((ulong)local_1e8.m_message.px & 0xffffffffffffff00);
  local_1e8._0_8_ = &PTR__lazy_ostream_0113a070;
  local_1e8.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_298 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/fs_tests.cpp"
  ;
  local_290 = "";
  local_1d0 = &local_1f8;
  boost::test_tools::tt_detail::report_assertion
            (&local_1c8,(lazy_ostream *)&local_1e8,1,0,WARN,_cVar6,(size_t)&local_298,0x9f);
  boost::detail::shared_count::~shared_count(&local_1c8.m_message.pn);
  std::filesystem::remove((path *)&symlink);
  std::filesystem::remove((path *)&dir);
  std::filesystem::__cxx11::path::~path(&symlink.super_path);
  std::filesystem::__cxx11::path::~path(&dir.super_path);
  std::filesystem::__cxx11::path::~path(&tmpfolder.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(create_directories)
{
    // Test fs::create_directories workaround.
    const fs::path tmpfolder{m_args.GetDataDirBase()};

    const fs::path dir{tmpfolder / "a"};
    fs::create_directory(dir);
    BOOST_CHECK(fs::exists(dir));
    BOOST_CHECK(fs::is_directory(dir));
    BOOST_CHECK(!fs::create_directories(dir));

    const fs::path symlink{tmpfolder / "b"};
    fs::create_directory_symlink(dir, symlink);
    BOOST_CHECK(fs::exists(symlink));
    BOOST_CHECK(fs::is_symlink(symlink));
    BOOST_CHECK(fs::is_directory(symlink));
    BOOST_CHECK(!fs::create_directories(symlink));

    fs::remove(symlink);
    fs::remove(dir);
}